

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

_Bool upb_Map_Next(upb_Map *map,upb_MessageValue *key,upb_MessageValue *val,size_t *iter)

{
  double dVar1;
  _Bool _Var2;
  upb_StringView *strp;
  upb_value v;
  upb_StringView k;
  upb_value local_40;
  double *local_38;
  upb_StringView local_30;
  
  _Var2 = upb_strtable_next2(&map->table,&local_30,&local_40,(intptr_t *)iter);
  if (_Var2) {
    if ((long)map->key_size == 0) {
      key->array_val = (upb_Array *)local_30.data;
      (key->str_val).size = local_30.size;
    }
    else {
      memcpy(key,local_30.data,(long)map->key_size);
    }
    local_38 = (double *)local_40.val;
    if ((long)map->val_size == 0) {
      dVar1 = *(double *)(local_40.val + 8);
      val->double_val = *(double *)local_40.val;
      (val->str_val).size = (size_t)dVar1;
    }
    else {
      memcpy(val,&local_38,(long)map->val_size);
    }
  }
  return _Var2;
}

Assistant:

bool upb_Map_Next(const upb_Map* map, upb_MessageValue* key,
                  upb_MessageValue* val, size_t* iter) {
  upb_StringView k;
  upb_value v;
  const bool ok = upb_strtable_next2(&map->table, &k, &v, (intptr_t*)iter);
  if (ok) {
    _upb_map_fromkey(k, key, map->key_size);
    _upb_map_fromvalue(v, val, map->val_size);
  }
  return ok;
}